

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O0

OptionalStorage<llvm::DWARFDebugNames::Entry,_false> * __thiscall
llvm::optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry,_false>::operator=
          (OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *this,Entry *y)

{
  bool bVar1;
  Entry *y_local;
  OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *this_local;
  
  bVar1 = hasValue(this);
  if (bVar1) {
    DWARFDebugNames::Entry::operator=((Entry *)this,y);
  }
  else {
    DWARFDebugNames::Entry::Entry((Entry *)this,y);
    this->hasVal = true;
  }
  return this;
}

Assistant:

OptionalStorage &operator=(T &&y) {
    if (hasValue()) {
      value = std::move(y);
    } else {
      ::new ((void *)std::addressof(value)) T(std::move(y));
      hasVal = true;
    }
    return *this;
  }